

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haptic.c
# Opt level: O0

_Bool al_upload_and_play_haptic_effect
                (ALLEGRO_HAPTIC *hap,ALLEGRO_HAPTIC_EFFECT *effect,ALLEGRO_HAPTIC_EFFECT_ID *id,
                int loop)

{
  _Bool _Var1;
  int in_ECX;
  ALLEGRO_HAPTIC_EFFECT_ID *in_RDX;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  _Var1 = al_upload_haptic_effect
                    ((ALLEGRO_HAPTIC *)in_RDX,
                     (ALLEGRO_HAPTIC_EFFECT *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                     (ALLEGRO_HAPTIC_EFFECT_ID *)0x1788fb);
  if (_Var1) {
    _Var1 = al_play_haptic_effect(in_RDX,in_ECX);
    if (_Var1) {
      local_1 = true;
    }
    else {
      al_release_haptic_effect((ALLEGRO_HAPTIC_EFFECT_ID *)0x178922);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_upload_and_play_haptic_effect(ALLEGRO_HAPTIC *hap,
   ALLEGRO_HAPTIC_EFFECT *effect, ALLEGRO_HAPTIC_EFFECT_ID *id, int loop)
{
   ASSERT(hap);
   ASSERT(effect);
   ASSERT(id);

   if (!al_upload_haptic_effect(hap, effect, id))
      return false;
   /* If playing the effect failed, unload the haptic effect automatically 
    */
   if (!al_play_haptic_effect(id, loop)) {
     al_release_haptic_effect(id);
     return false;
   }
   return true;
}